

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_member
          (Dispatch_Engine *this,string *t_name,atomic_uint_fast32_t *t_loc,Function_Params *params,
          bool t_has_params,Type_Conversions_State *t_conversions)

{
  type_info **pptVar1;
  Boxed_Value *t_hint;
  type_info *ptVar2;
  element_type *peVar3;
  element_type *peVar4;
  Function_Params *plist;
  bool bVar5;
  int iVar6;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *f_1;
  long *plVar7;
  dispatch_error *this_00;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long lVar10;
  undefined7 in_register_00000081;
  element_type *l_funs;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *f;
  type_info *__x;
  Boxed_Value BVar11;
  string_view t_name_00;
  Function_Params l_params;
  Function_Params l_params_00;
  Type_Conversions_State *in_stack_00000008;
  exception_ptr except;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> tmp_params;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  functions;
  anon_class_8_1_8991fb9c do_attribute_call;
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  funs;
  allocator_type local_10a [2];
  long local_108;
  Function_Params *local_100;
  undefined1 local_f8 [32];
  Boxed_Value local_d8;
  undefined1 local_c8 [24];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_b0;
  undefined8 local_98;
  undefined1 local_90 [8];
  string *local_88;
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_80 [2];
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  local_100 = (Function_Params *)CONCAT71(in_register_00000081,t_has_params);
  t_hint = params->m_begin;
  t_name_00._M_str = (char *)(t_loc->super___atomic_base<unsigned_long>)._M_i;
  t_name_00._M_len = t_loc[1].super___atomic_base<unsigned_long>._M_i;
  local_98 = t_loc;
  get_function(local_80,(Dispatch_Engine *)t_name,t_name_00,(size_t)t_hint);
  plist = local_100;
  if ((Boxed_Value *)local_80[0].first != t_hint) {
    LOCK();
    params->m_begin = (Boxed_Value *)local_80[0].first;
    UNLOCK();
  }
  local_88 = t_name;
  bVar5 = is_attribute_call(local_80[0].second.
                            super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,local_100,SUB81(t_conversions,0),in_stack_00000008);
  if (bVar5) {
    l_params.m_end = plist->m_begin;
    l_params.m_begin = (Boxed_Value *)0x1;
    BVar11 = call_member::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)this,(int)&local_88,l_params,
                        (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                         *)plist->m_end,
                        (Type_Conversions_State *)
                        local_80[0].second.
                        super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    _Var9._M_pi = BVar11.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_00348c19;
  }
  local_108 = 0;
  if (*(Conversion_Saves **)
       local_80[0].second.
       super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr ==
      ((reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *)
      ((long)local_80[0].second.
             super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + 8))->_M_data) {
    local_c8._0_8_ = (long *)0x0;
    local_c8._8_8_ = (long *)0x0;
    local_c8._16_8_ = 0;
    get_method_missing_functions((Dispatch_Engine *)local_f8);
    __x = *(type_info **)local_f8._0_8_;
    ptVar2 = *(type_info **)(local_f8._0_8_ + 8);
    if (__x != ptVar2) {
      do {
        peVar3 = ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                   *)&__x->field_0x0)->_M_ptr;
        iVar6 = (*peVar3->_vptr_Proxy_Function_Base[6])(peVar3,plist->m_begin,in_stack_00000008);
        if ((char)iVar6 != '\0') {
          std::
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          ::push_back((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                       *)local_c8,(value_type *)__x);
        }
        __x = __x + 0x10;
      } while (__x != ptVar2);
    }
    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    plVar7 = (long *)local_c8._0_8_;
    if (local_c8._0_8_ == local_c8._8_8_) {
      if (local_108 != 0) {
        local_90 = (undefined1  [8])local_108;
        std::__exception_ptr::exception_ptr::_M_addref();
        uVar8 = std::rethrow_exception((exception_ptr)local_90);
        if (local_108 != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        if (local_80[0].second.
            super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80[0].second.
                     super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        _Unwind_Resume(uVar8);
      }
      this_00 = (dispatch_error *)__cxa_allocate_exception(0x40);
      std::
      vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                  *)&local_50,
                 *(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> **)
                  local_80[0].second.
                  super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
                          ((reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *)
                          ((long)local_80[0].second.
                                 super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8))->_M_data,(allocator_type *)local_f8);
      chaiscript::exception::dispatch_error::dispatch_error(this_00,local_100,&local_50);
      __cxa_throw(this_00,&chaiscript::exception::dispatch_error::typeinfo,
                  chaiscript::exception::dispatch_error::~dispatch_error);
    }
LAB_00348a8f:
    if (*(int *)(*plVar7 + 0x20) == 2) goto code_r0x00348a9c;
    local_f8._0_8_ =
         (plist->m_begin->m_data).
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8._8_8_ =
         (plist->m_begin->m_data).
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((element_type *)local_f8._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pptVar1 = &(((element_type *)local_f8._8_8_)->m_type_info).m_bare_type_info;
        *(int *)pptVar1 = *(int *)pptVar1 + 1;
        UNLOCK();
      }
      else {
        pptVar1 = &(((element_type *)local_f8._8_8_)->m_type_info).m_bare_type_info;
        *(int *)pptVar1 = *(int *)pptVar1 + 1;
      }
    }
    Boxed_Value::Boxed_Value<std::__cxx11::string_const&,void>
              ((Boxed_Value *)(local_f8 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,false);
    std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
    vector<chaiscript::Boxed_Value_const*,void>
              ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&local_b0,
               plist->m_begin + 1,plist->m_end,local_10a);
    Boxed_Value::
    Boxed_Value<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,void>
              (&local_d8,&local_b0,false);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_b0);
    local_b0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_f8;
    local_b0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8;
    dispatch::
    dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
              ((dispatch *)this,
               (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)local_c8,(Function_Params *)&local_b0,in_stack_00000008);
    lVar10 = 0x30;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_100 + lVar10) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_100 + lVar10));
      }
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != 0);
    goto LAB_00348bfd;
  }
  BVar11 = dispatch::
           dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                     ((dispatch *)this,
                      local_80[0].second.
                      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,plist,in_stack_00000008);
  _Var9._M_pi = BVar11.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  goto LAB_00348c07;
code_r0x00348a9c:
  plVar7 = plVar7 + 2;
  if (plVar7 == (long *)local_c8._8_8_) goto code_r0x00348aa5;
  goto LAB_00348a8f;
code_r0x00348aa5:
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  vector<chaiscript::Boxed_Value_const*,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)local_f8,
             plist->m_begin,plist->m_end,(allocator_type *)&local_b0);
  uVar8 = local_f8._0_8_;
  Boxed_Value::Boxed_Value<std::__cxx11::string_const&,void>
            ((Boxed_Value *)&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,false);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::_M_insert_rval
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_f8,
             (Boxed_Value *)(uVar8 + 0x10),(value_type *)&local_b0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_b0.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b0.
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  l_funs = (element_type *)local_f8._8_8_;
  peVar4 = (element_type *)local_f8._0_8_;
  if (local_f8._0_8_ == local_f8._8_8_) {
    l_funs = (element_type *)0x0;
    peVar4 = (element_type *)0x0;
  }
  l_params_00.m_end = (Boxed_Value *)peVar4;
  l_params_00.m_begin = (Boxed_Value *)0x2;
  call_member::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)this,(int)&local_88,l_params_00,
             (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)l_funs,(Type_Conversions_State *)local_c8);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_f8);
LAB_00348bfd:
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             *)local_c8);
  _Var9._M_pi = extraout_RDX;
LAB_00348c07:
  if (local_108 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
    _Var9._M_pi = extraout_RDX_00;
  }
LAB_00348c19:
  if (local_80[0].second.
      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80[0].second.
               super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_01;
  }
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value call_member(const std::string &t_name,
                              std::atomic_uint_fast32_t &t_loc,
                              const Function_Params &params,
                              bool t_has_params,
                              const Type_Conversions_State &t_conversions) {
        uint_fast32_t loc = t_loc;
        const auto funs = get_function(t_name, loc);
        if (funs.first != loc) {
          t_loc = uint_fast32_t(funs.first);
        }

        const auto do_attribute_call = [this](int l_num_params,
                                              Function_Params l_params,
                                              const std::vector<Proxy_Function> &l_funs,
                                              const Type_Conversions_State &l_conversions) -> Boxed_Value {
          Function_Params attr_params(l_params.begin(), l_params.begin() + l_num_params);
          Boxed_Value bv = dispatch::dispatch(l_funs, attr_params, l_conversions);
          if (l_num_params < int(l_params.size()) || bv.get_type_info().bare_equal(user_type<dispatch::Proxy_Function_Base>())) {
            struct This_Foist {
              This_Foist(Dispatch_Engine &e, const Boxed_Value &t_bv)
                  : m_e(e) {
                m_e.get().new_scope();
                m_e.get().add_object("__this", t_bv);
              }

              ~This_Foist() { m_e.get().pop_scope(); }

              std::reference_wrapper<Dispatch_Engine> m_e;
            };

            This_Foist fi(*this, l_params.front());

            try {
              auto func = boxed_cast<const dispatch::Proxy_Function_Base *>(bv);
              try {
                return (*func)({l_params.begin() + l_num_params, l_params.end()}, l_conversions);
              } catch (const chaiscript::exception::bad_boxed_cast &) {
              } catch (const chaiscript::exception::arity_error &) {
              } catch (const chaiscript::exception::guard_error &) {
              }
              throw chaiscript::exception::dispatch_error({l_params.begin() + l_num_params, l_params.end()},
                                                          std::vector<Const_Proxy_Function>{boxed_cast<Const_Proxy_Function>(bv)});
            } catch (const chaiscript::exception::bad_boxed_cast &) {
              // unable to convert bv into a Proxy_Function_Base
              throw chaiscript::exception::dispatch_error({l_params.begin() + l_num_params, l_params.end()},
                                                          std::vector<Const_Proxy_Function>(l_funs.begin(), l_funs.end()));
            }
          } else {
            return bv;
          }
        };

        if (is_attribute_call(*funs.second, params, t_has_params, t_conversions)) {
          return do_attribute_call(1, params, *funs.second, t_conversions);
        } else {
          std::exception_ptr except;

          if (!funs.second->empty()) {
            try {
              return dispatch::dispatch(*funs.second, params, t_conversions);
            } catch (chaiscript::exception::dispatch_error &) {
              except = std::current_exception();
            }
          }

          // If we get here we know that either there was no method with that name,
          // or there was no matching method

          const auto functions = [&]() -> std::vector<Proxy_Function> {
            std::vector<Proxy_Function> fs;

            const auto method_missing_funs = get_method_missing_functions();

            for (const auto &f : *method_missing_funs) {
              if (f->compare_first_type(params[0], t_conversions)) {
                fs.push_back(f);
              }
            }

            return fs;
          }();

          const bool is_no_param = [&]() -> bool {
            for (const auto &f : functions) {
              if (f->get_arity() != 2) {
                return false;
              }
            }
            return true;
          }();

          if (!functions.empty()) {
            try {
              if (is_no_param) {
                auto tmp_params = params.to_vector();
                tmp_params.insert(tmp_params.begin() + 1, var(t_name));
                return do_attribute_call(2, Function_Params(tmp_params), functions, t_conversions);
              } else {
                std::array<Boxed_Value, 3> p{params[0], var(t_name), var(std::vector<Boxed_Value>(params.begin() + 1, params.end()))};
                return dispatch::dispatch(functions, Function_Params{p}, t_conversions);
              }
            } catch (const dispatch::option_explicit_set &e) {
              throw chaiscript::exception::dispatch_error(params,
                                                          std::vector<Const_Proxy_Function>(funs.second->begin(), funs.second->end()),
                                                          e.what());
            }
          }

          // If we get all the way down here we know there was no "method_missing"
          // method at all.
          if (except) {
            std::rethrow_exception(except);
          } else {
            throw chaiscript::exception::dispatch_error(params,
                                                        std::vector<Const_Proxy_Function>(funs.second->begin(), funs.second->end()));
          }
        }
      }